

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

void ps_hints_t1stem3(PS_Hints hints,FT_UInt dimension,FT_Fixed *stems)

{
  FT_Memory memory;
  FT_Error FVar1;
  FT_Int FVar2;
  FT_Fixed FVar3;
  FT_Fixed FVar4;
  PS_Mask pPVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  PS_Mask pPVar9;
  bool bVar10;
  PS_Mask local_58;
  FT_Int idx [3];
  
  if (hints->error != 0) {
    return;
  }
  bVar10 = dimension != 0;
  if (hints->hint_type != PS_HINT_TYPE_1) {
    FVar1 = 6;
    goto LAB_001546fa;
  }
  memory = hints->memory;
  for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
    FVar3 = FT_RoundFix(*(FT_Fixed *)((long)stems + lVar7 * 4));
    FVar4 = FT_RoundFix(*(FT_Fixed *)((long)stems + lVar7 * 4 + 8));
    FVar1 = ps_dimension_add_t1stem
                      (hints->dimension + bVar10,(FT_Int)((ulong)FVar3 >> 0x10),
                       (FT_Int)((ulong)FVar4 >> 0x10),memory,(FT_Int *)((long)idx + lVar7));
    if (FVar1 != 0) goto LAB_001546fa;
  }
  uVar8 = (ulong)hints->dimension[bVar10].counters.num_masks;
  pPVar9 = hints->dimension[bVar10].counters.masks;
  pPVar5 = pPVar9 + uVar8;
  while (iVar6 = (int)uVar8, uVar8 = (ulong)(iVar6 - 1), iVar6 != 0) {
    FVar2 = ps_mask_test_bit(pPVar9,idx[0]);
    local_58 = pPVar9;
    if (((FVar2 != 0) || (FVar2 = ps_mask_test_bit(pPVar9,idx[1]), FVar2 != 0)) ||
       (FVar2 = ps_mask_test_bit(pPVar9,idx[2]), FVar2 != 0)) goto LAB_0015477d;
    pPVar9 = pPVar9 + 1;
  }
  local_58 = pPVar5;
  FVar1 = ps_mask_table_alloc(&hints->dimension[bVar10].counters,memory,&local_58);
  if (FVar1 != 0) goto LAB_001546fa;
LAB_0015477d:
  if ((-1 < idx[0]) && (FVar1 = ps_mask_set_bit(local_58,idx[0],memory), FVar1 != 0))
  goto LAB_001546fa;
  pPVar9 = local_58;
  if (idx[1] < 0) {
    if (idx[2] < 0) {
      return;
    }
LAB_001547fb:
    FVar1 = ps_mask_set_bit(pPVar9,idx[2],memory);
  }
  else {
    FVar1 = ps_mask_set_bit(local_58,idx[1],memory);
    if (-1 < idx[2] && FVar1 == 0) goto LAB_001547fb;
  }
  if (FVar1 == 0) {
    return;
  }
LAB_001546fa:
  hints->error = FVar1;
  return;
}

Assistant:

static void
  ps_hints_t1stem3( PS_Hints   hints,
                    FT_UInt    dimension,
                    FT_Fixed*  stems )
  {
    FT_Error  error = FT_Err_Ok;


    if ( !hints->error )
    {
      PS_Dimension  dim;
      FT_Memory     memory = hints->memory;
      FT_Int        count;
      FT_Int        idx[3];


      /* limit "dimension" to 0..1 */
      if ( dimension > 1 )
      {
        FT_TRACE0(( "ps_hints_t1stem3: invalid dimension (%d) used\n",
                    dimension ));
        dimension = ( dimension != 0 );
      }

      dim = &hints->dimension[dimension];

      /* there must be 6 elements in the 'stem' array */
      if ( hints->hint_type == PS_HINT_TYPE_1 )
      {
        /* add the three stems to our hints/masks table */
        for ( count = 0; count < 3; count++, stems += 2 )
        {
          error = ps_dimension_add_t1stem( dim,
                                           (FT_Int)FIXED_TO_INT( stems[0] ),
                                           (FT_Int)FIXED_TO_INT( stems[1] ),
                                           memory, &idx[count] );
          if ( error )
            goto Fail;
        }

        /* now, add the hints to the counters table */
        error = ps_dimension_add_counter( dim, idx[0], idx[1], idx[2],
                                          memory );
        if ( error )
          goto Fail;
      }
      else
      {
        FT_ERROR(( "ps_hints_t1stem3: called with invalid hint type\n" ));
        error = FT_THROW( Invalid_Argument );
        goto Fail;
      }
    }

    return;

  Fail:
    FT_ERROR(( "ps_hints_t1stem3: could not add counter stems to table\n" ));
    hints->error = error;
  }